

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SRGBTestProgram::setUniformToggle
          (SRGBTestProgram *this,int location,bool toggleDecodeValue)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  TestError *this_00;
  bool toggleDecodeValue_local;
  int location_local;
  SRGBTestProgram *this_local;
  
  bVar1 = std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
          ::empty(&this->m_uniformDataList);
  if ((!bVar1) && (-1 < location)) {
    sVar2 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
            ::size(&this->m_uniformDataList);
    if (location <= (int)sVar2) {
      pvVar3 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::UniformData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformData>_>
               ::operator[](&this->m_uniformDataList,(long)location);
      pvVar3->toggleDecode = toggleDecodeValue;
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,
             "Error: Uniform location not found. glGetActiveUniforms returned uniforms incorrectly "
             ,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSRGBDecodeTests.cpp"
             ,0x2c8);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void SRGBTestProgram::setUniformToggle (int location, bool toggleDecodeValue)
{
	if ( (m_uniformDataList.empty() == false) && (location >= 0) && (location <= (int)m_uniformDataList.size()) )
	{
		m_uniformDataList[location].toggleDecode = toggleDecodeValue;
	}
	else
	{
		TCU_THROW(TestError, "Error: Uniform location not found. glGetActiveUniforms returned uniforms incorrectly ");
	}
}